

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O3

void __thiscall
JetHead::vector<Regex::GroupData>::sizeup(vector<Regex::GroupData> *this,uint newSize)

{
  long lVar1;
  long *plVar2;
  GroupData *pGVar3;
  long *plVar4;
  ulong uVar5;
  GroupData *pGVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  ulong uVar9;
  
  uVar9 = 0x20;
  if (this->mAllocated != 0) {
    uVar9 = (ulong)(this->mAllocated * 2);
  }
  if (newSize != 0) {
    uVar9 = (ulong)newSize;
  }
  pGVar3 = (GroupData *)operator_new__(uVar9 * 0x28);
  pGVar6 = this->mData;
  if (pGVar6 != (GroupData *)0x0) {
    if (this->mSize != 0) {
      paVar7 = &(pGVar3->string).field_2;
      lVar8 = 0x18;
      uVar5 = 0;
      do {
        pGVar6 = this->mData;
        *(undefined8 *)((long)paVar7 + -0x18) = *(undefined8 *)((long)pGVar6 + lVar8 + -0x18);
        (((string *)(paVar7 + -1))->_M_dataplus)._M_p = (pointer)paVar7;
        lVar1 = *(long *)((long)pGVar6 + lVar8 + -0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(paVar7 + -1),lVar1,*(long *)((long)pGVar6 + lVar8 + -8) + lVar1);
        plVar2 = *(long **)((long)this->mData + lVar8 + -0x10);
        plVar4 = (long *)((long)&this->mData->start_pos + lVar8);
        if (plVar4 != plVar2) {
          operator_delete(plVar2,*plVar4 + 1);
        }
        uVar5 = uVar5 + 1;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)paVar7 + 0x28);
        lVar8 = lVar8 + 0x28;
      } while (uVar5 < this->mSize);
      pGVar6 = this->mData;
      if (pGVar6 == (GroupData *)0x0) goto LAB_0011d884;
    }
    operator_delete__(pGVar6);
  }
LAB_0011d884:
  this->mData = pGVar3;
  this->mAllocated = (uint)uVar9;
  return;
}

Assistant:

void sizeup(unsigned newSize=0)
		{
			// No size was specified, double the existing size.
			// Doubling a self-expanding array means that storing O(n) 
			// elements takes O(n lg n) worst case.  Adding only a 
			// constant number of elements makes that O(n^2).
			if (newSize == 0) 
			{
				// If we allocated ANYTHING yet, then double it, if 
				// not just use the default size.
				if (mAllocated)
				{
					newSize = mAllocated * 2;
				} else {
					newSize = DEFAULT_ALLOCATION;
				}
			}

			// A new buffer
			T* temp = (T*)(new uint8_t[sizeof(T) * newSize]);

			// If we had data, copy it over
			if (mData)
			{
				// Move all of my data into the new buffer (copy then delete)
				for (unsigned i = 0; i < mSize; i++)
				{
					new(temp + i) T(mData[i]);
					mData[i].~T();
				}
				
				// Delete old buffer
				delete[] (uint8_t*)mData;
			}
			
			// Keep new buffer
			mData = temp;

			// Remember new allocation size
			mAllocated = newSize;
		}